

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void __thiscall vw::learn(vw *this,example *ec)

{
  learner<char,_char> *l;
  single_learner *psVar1;
  vw_exception *this_00;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  l = this->l;
  if (l[0xe8] == (learner<char,_char>)0x1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_190,"This reduction does not support single-line examples.");
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
               ,0x90,&local_1c0);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if ((ec->test_only == false) && (this->training != false)) {
    psVar1 = LEARNER::as_singleline<char,char>(l);
    LEARNER::learner<char,_example>::learn(psVar1,ec,0);
    return;
  }
  psVar1 = LEARNER::as_singleline<char,char>(l);
  LEARNER::learner<char,_example>::predict(psVar1,ec,0);
  return;
}

Assistant:

void vw::learn(example& ec)
{
  if (l->is_multiline)
    THROW("This reduction does not support single-line examples.");

  if (ec.test_only || !training)
    LEARNER::as_singleline(l)->predict(ec);
  else
    LEARNER::as_singleline(l)->learn(ec);
}